

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t f_cmp_fkind(void *a,void *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  feature *pfVar3;
  feature *pfVar4;
  wchar_t c;
  feature *fb;
  feature *fa;
  int b_val;
  int a_val;
  void *b_local;
  void *a_local;
  
  wVar2 = *b;
  pfVar3 = f_info + *a;
  pfVar4 = f_info + wVar2;
  wVar1 = feat_order(*a);
  wVar2 = feat_order(wVar2);
  a_local._4_4_ = wVar1 - wVar2;
  if (a_local._4_4_ == L'\0') {
    a_local._4_4_ = strcmp(pfVar3->name,pfVar4->name);
  }
  return a_local._4_4_;
}

Assistant:

static int f_cmp_fkind(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct feature *fa = &f_info[a_val];
	const struct feature *fb = &f_info[b_val];

	/* Group by */
	int c = feat_order(a_val) - feat_order(b_val);
	if (c) return c;

	/* Order by feature name */
	return strcmp(fa->name, fb->name);
}